

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::SoPlexBase<double>::getBoundViolationRational
          (SoPlexBase<double> *this,Rational *maxviol,Rational *sumviol)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  long lVar3;
  type t;
  Rational viol;
  string local_118;
  uint local_f8;
  void *local_f0;
  char local_e3;
  char local_e2;
  string local_d0;
  rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_b0;
  uint local_a4;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_a0;
  string local_98;
  data_type local_78;
  char local_63;
  char local_62;
  data_type local_58;
  char local_43;
  char local_42;
  
  if (this->_hasSolReal == true) {
    in_RAX = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_a4 = (uint)in_RAX;
    if (((this->_solReal).field_0x98 & 1) != 0) goto LAB_0033254a;
  }
  if (this->_hasSolRational == true) {
    local_a4 = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),(this->_solRational).field_0xd0) &
               0xffffff01;
  }
  else {
    local_a4 = 0;
  }
LAB_0033254a:
  if ((char)local_a4 != '\0') {
    local_b0 = (rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)sumviol;
    if (this->_currentSettings->_intParamValues[0xf] == 0) {
      _syncLPRational(this,false);
    }
    if ((this->_hasSolReal == true) && (this->_hasSolRational == false)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
      ::operator=((SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>>
                   *)&this->_solRational,&this->_solReal);
      this->_hasSolRational = true;
    }
    local_118._M_dataplus._M_p = (pointer)0x0;
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                 *)maxviol,(longlong *)&local_118);
    local_118._M_dataplus._M_p = (pointer)0x0;
    boost::
    rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
    ::operator=((rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>,(boost::multiprecision::expression_template_option)1>>
                 *)local_b0,(longlong *)&local_118);
    lVar3 = (long)(this->_rationalLP->
                  super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  ).
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  .set.thenum;
    if (0 < lVar3) {
      local_a0 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&(maxviol->m_backend).m_value.den;
      lVar2 = lVar3 + 1;
      lVar3 = lVar3 << 6;
      do {
        local_118._M_dataplus._M_p =
             (pointer)((long)&(this->_rationalLP->
                              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              ).low.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value +
                      lVar3);
        local_118._M_string_length =
             (long)((this->_solRational)._primal.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 0xffffffffffffffff) + lVar3;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        number<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_78.ld,
                   (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_118,(type *)0x0);
        local_d0._M_dataplus._M_p = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_118,(longlong *)&local_d0,(type *)0x0);
        iVar1 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_78.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_118);
        if ((local_e3 == '\0') && (local_e2 == '\0')) {
          operator_delete(local_f0,(ulong)local_f8 << 3);
        }
        if ((local_118.field_2._M_local_buf[5] == '\0') &&
           (local_118.field_2._M_local_buf[6] == '\0')) {
          operator_delete((void *)local_118._M_string_length,
                          ((ulong)local_118._M_dataplus._M_p & 0xffffffff) << 3);
        }
        if (0 < iVar1) {
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator+=(local_b0,(rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 *)&local_78.ld);
          iVar1 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_78.ld,&maxviol->m_backend);
          if (0 < iVar1) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)maxviol,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_78.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign(local_a0,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               *)&local_58.ld);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_118,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)&local_78.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_d0,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)((long)&(this->_rationalLP->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                        ).low.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                        m_value + lVar3),0,
                             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_98,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)((long)((this->_solRational)._primal.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                       0xffffffffffffffff) + lVar3),0,
                             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              CONCAT17(local_118.field_2._M_local_buf[7],
                                       CONCAT16(local_118.field_2._M_local_buf[6],
                                                CONCAT15(local_118.field_2._M_local_buf[5],
                                                         local_118.field_2._M_allocated_capacity.
                                                         _0_5_))) + 1);
            }
          }
        }
        local_118._M_dataplus._M_p =
             (pointer)((long)((this->_solRational)._primal.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 0xffffffffffffffff) +
                      lVar3);
        local_118._M_string_length =
             (long)&(this->_rationalLP->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    ).up.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.m_value + lVar3;
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::
        do_assign<boost::multiprecision::detail::expression<boost::multiprecision::detail::subtract_immediates,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>,void,void>>
                  ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
                    *)&local_78.ld,
                   (expression<boost::multiprecision::detail::subtract_immediates,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_void,_void>
                    *)&local_118,(subtract_immediates *)&local_d0);
        local_d0._M_dataplus._M_p = (pointer)0x0;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)&local_118,(longlong *)&local_d0,(type *)0x0);
        iVar1 = boost::multiprecision::backends::
                rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_78.ld,
                          (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                           *)&local_118);
        if ((local_e3 == '\0') && (local_e2 == '\0')) {
          operator_delete(local_f0,(ulong)local_f8 << 3);
        }
        if ((local_118.field_2._M_local_buf[5] == '\0') &&
           (local_118.field_2._M_local_buf[6] == '\0')) {
          operator_delete((void *)local_118._M_string_length,
                          ((ulong)local_118._M_dataplus._M_p & 0xffffffff) << 3);
        }
        if (0 < iVar1) {
          boost::
          rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator+=(local_b0,(rational<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>_>
                                 *)&local_78.ld);
          iVar1 = boost::multiprecision::backends::
                  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                  ::compare((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                             *)&local_78.ld,&maxviol->m_backend);
          if (0 < iVar1) {
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign((cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)maxviol,
                     (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                      *)&local_78.ld);
            boost::multiprecision::backends::
            cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
            ::assign(local_a0,(cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                               *)&local_58.ld);
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_118,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)&local_78.ld,0,~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_d0,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)((long)&(this->_rationalLP->
                                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                        ).up.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.
                                        m_value + lVar3),0,
                             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
            ::str_abi_cxx11_(&local_98,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                              *)((long)((this->_solRational)._primal.val.
                                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                       0xffffffffffffffff) + lVar3),0,
                             ~(_S_ios_fmtflags_min|_S_ios_fmtflags_max));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,
                              CONCAT17(local_118.field_2._M_local_buf[7],
                                       CONCAT16(local_118.field_2._M_local_buf[6],
                                                CONCAT15(local_118.field_2._M_local_buf[5],
                                                         local_118.field_2._M_allocated_capacity.
                                                         _0_5_))) + 1);
            }
          }
        }
        if ((local_43 == '\0') && (local_42 == '\0')) {
          operator_delete(local_58.ld.data,(ulong)local_58.ld.capacity << 3);
        }
        if ((local_63 == '\0') && (local_62 == '\0')) {
          operator_delete(local_78.ld.data,(ulong)local_78.ld.capacity << 3);
        }
        lVar2 = lVar2 + -1;
        lVar3 = lVar3 + -0x40;
      } while (1 < lVar2);
    }
  }
  return SUB41(local_a4,0);
}

Assistant:

bool SoPlexBase<R>::getBoundViolationRational(Rational& maxviol, Rational& sumviol)
{
   if(!isPrimalFeasible())
      return false;

   // if we have to synchronize, we do not measure time, because this would affect the solving statistics
   if(intParam(SoPlexBase<R>::SYNCMODE) == SYNCMODE_ONLYREAL)
      _syncLPRational(false);

   _syncRationalSolution();
   VectorRational& primal = _solRational._primal;
   assert(primal.dim() == numColsRational());

   maxviol = 0;
   sumviol = 0;

   for(int i = numColsRational() - 1; i >= 0; i--)
   {
      Rational viol = lowerRational(i) - primal[i];

      if(viol > 0)
      {
         sumviol += viol;

         if(viol > maxviol)
         {
            maxviol = viol;
            SPxOut::debug(this, "increased bound violation for column {}: {} lower: {}, primal {}\n", i,
                          viol.str(), lowerRational(i).str(), primal[i].str());
         }
      }

      viol = primal[i] - upperRational(i);

      if(viol > 0)
      {
         sumviol += viol;

         if(viol > maxviol)
         {
            maxviol = viol;
            SPxOut::debug(this, "increased bound violation for column {}: {} upper: {}, primal {}\n", i,
                          viol.str(), upperRational(i).str(), primal[i].str());
         }
      }
   }

   return true;
}